

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void ghc::filesystem::copy_symlink(path *existing_symlink,path *new_symlink)

{
  int code;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  string sStack_58;
  error_code local_38;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  copy_symlink(existing_symlink,new_symlink,&local_38);
  code = local_38._M_value;
  if (local_38._M_value == 0) {
    return;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&sStack_58,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_38._M_cat;
  filesystem_error::filesystem_error(this,&sStack_58,existing_symlink,new_symlink,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void copy_symlink(const path& existing_symlink, const path& new_symlink)
{
    std::error_code ec;
    copy_symlink(existing_symlink, new_symlink, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), existing_symlink, new_symlink, ec);
    }
}